

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O1

void deqp::gles3::Functional::translateStencilState(StencilState *src,StencilState *dst)

{
  TestFunc TVar1;
  StencilOp SVar2;
  
  TVar1 = sglr::rr_util::mapGLTestFunc(src->function);
  dst->func = TVar1;
  dst->ref = src->reference;
  dst->compMask = src->compareMask;
  SVar2 = sglr::rr_util::mapGLStencilOp(src->stencilFailOp);
  dst->sFail = SVar2;
  SVar2 = sglr::rr_util::mapGLStencilOp(src->depthFailOp);
  dst->dpFail = SVar2;
  SVar2 = sglr::rr_util::mapGLStencilOp(src->depthPassOp);
  dst->dpPass = SVar2;
  dst->writeMask = src->writeMask;
  return;
}

Assistant:

void translateStencilState (const StencilState& src, rr::StencilState& dst)
{
	dst.func		= sglr::rr_util::mapGLTestFunc(src.function);
	dst.ref			= src.reference;
	dst.compMask	= src.compareMask;
	dst.sFail		= sglr::rr_util::mapGLStencilOp(src.stencilFailOp);
	dst.dpFail		= sglr::rr_util::mapGLStencilOp(src.depthFailOp);
	dst.dpPass		= sglr::rr_util::mapGLStencilOp(src.depthPassOp);
	dst.writeMask	= src.writeMask;
}